

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O2

size_t __thiscall
EncodingConversion::encode
          (EncodingConversion *this,u16string *string,size_t *start_offset,size_t end_offset,
          char *output_buffer,size_t output_length,bool is_at_end)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint16_t replacement_characters [2];
  char *input_pointer;
  pointer local_58;
  size_t *local_50;
  char *local_48;
  char *replacement_text;
  char *output_pointer;
  
  pcVar1 = (string->_M_dataplus)._M_p;
  input_pointer = (char *)(pcVar1 + *start_offset);
  local_58 = (pointer)input_pointer;
  local_50 = start_offset;
  local_48 = output_buffer;
  output_pointer = output_buffer;
  do {
    while (uVar3 = convert(this,&input_pointer,(char *)(pcVar1 + end_offset),&output_pointer,
                           output_buffer + output_length), uVar3 == 2) {
      bVar2 = false;
LAB_0015066d:
      replacement_characters[0] = 0xfffd;
      replacement_characters[1] = 0;
      replacement_text = (char *)replacement_characters;
      iVar4 = convert(this,&replacement_text,(char *)(replacement_characters + 1),&output_pointer,
                      output_buffer + output_length);
      if ((iVar4 != 0) || (input_pointer = input_pointer + 2, bVar2)) goto LAB_001506a5;
    }
    if (uVar3 == 3) {
      bVar2 = true;
      if (is_at_end) goto LAB_0015066d;
      goto LAB_001506a5;
    }
    if (uVar3 < 2) {
LAB_001506a5:
      *local_50 = *local_50 + ((long)input_pointer - (long)local_58) / 2;
      return (long)output_pointer - (long)local_48;
    }
  } while( true );
}

Assistant:

size_t EncodingConversion::encode(const u16string &string, size_t *start_offset,
                                  size_t end_offset, char *output_buffer,
                                  size_t output_length, bool is_at_end) {
  const char *input_start = reinterpret_cast<const char *>(string.data() + *start_offset);
  const char *input_end = reinterpret_cast<const char *>(string.data() + end_offset);
  const char *input_pointer = input_start;
  char *output_pointer = output_buffer;
  char *output_end = output_buffer + output_length;

  bool done = false;
  while (!done) {
    int conversion_result = convert(
      &input_pointer,
      input_end,
      &output_pointer,
      output_end
    );

    switch (conversion_result) {
      case Ok:
      case Partial:
        done = true;
        break;

      case InvalidTrailing:
        done = true;
        if (!is_at_end) break;

      case Invalid:
        uint16_t replacement_characters[] = {replacement_character, 0};
        const char *replacement_text = reinterpret_cast<const char *>(replacement_characters);
        if (convert(
          &replacement_text,
          replacement_text + bytes_per_character,
          &output_pointer,
          output_end
        ) != Ok) {
          done = true;
        } else {
          input_pointer += bytes_per_character;
        }
        break;
    }
  }

  *start_offset += (input_pointer - input_start) / bytes_per_character;
  return output_pointer - output_buffer;
}